

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::addSamplerString(CLIntercept *this,cl_sampler sampler,string *str)

{
  mapped_type *pmVar1;
  cl_sampler local_20;
  
  if (sampler != (cl_sampler)0x0) {
    local_20 = sampler;
    std::mutex::lock(&this->m_Mutex);
    pmVar1 = std::
             map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_SamplerDataMap,&local_20);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addSamplerString(
    cl_sampler sampler,
    const std::string& str )
{
    if( sampler )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_SamplerDataMap[sampler] = str;
    }
}